

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_astat(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *area_00;
  bool bVar1;
  char *pcVar2;
  long in_RDI;
  AREA_AFFECT_DATA *paf;
  AREA_DATA_conflict *pArea;
  AREA_DATA_conflict *area;
  int count;
  char buf [4608];
  int in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  char *in_stack_ffffffffffffed60;
  char *local_1298;
  uint local_128c;
  AREA_AFFECT_DATA *local_1238;
  AREA_DATA_conflict *local_1230;
  int local_121c;
  char local_1218 [4632];
  
  local_121c = 0;
  area_00 = *(AREA_DATA_conflict **)(*(long *)(in_RDI + 0xa8) + 0x30);
  if (area_00 == (AREA_DATA_conflict *)0x0) {
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
  }
  else {
    sprintf(local_1218,"Area Name: %s\n\r",area_00->name);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Author: %s\n\r",area_00->credits);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Filename: %s\n\r",area_00->file_name);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Vnum range: %d to %d\n\r",(ulong)(uint)(int)area_00->min_vnum,
            (ulong)(uint)(int)area_00->max_vnum);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Recommended levels: %d to %d\n\r",(ulong)(uint)(int)area_00->low_range,
            (ulong)(uint)(int)area_00->high_range);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Area \'age\': %d  [Area repops when age = 30, or 6 if empty.]\n\r",
            (ulong)(uint)(int)area_00->age);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Number of players in area: %d\n\r",(ulong)(uint)(int)area_00->nplayer);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Climate: %s\n\r",climate_table[area_00->climate].name);
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Current temperature: ");
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    switch(area_00->temp) {
    case 0:
      sprintf(local_1218,"Hot\n\r");
      break;
    case 1:
      sprintf(local_1218,"Warm\n\r");
      break;
    case 2:
      sprintf(local_1218,"Cool\n\r");
      break;
    case 3:
      sprintf(local_1218,"Cold\n\r");
      break;
    default:
      sprintf(local_1218,"None (error)\n\r");
    }
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Current wind conditions: ");
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    switch(area_00->wind) {
    case 0:
      sprintf(local_1218,"Calm\n\r");
      break;
    case 1:
      sprintf(local_1218,"Breeze\n\r");
      break;
    case 2:
      sprintf(local_1218,"Windy\n\r");
      break;
    case 3:
      sprintf(local_1218,"Gale\n\r");
      break;
    default:
      sprintf(local_1218,"None (error)\n\r");
    }
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    sprintf(local_1218,"Current sky conditions: ");
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    switch(area_00->sky) {
    case 0:
      sprintf(local_1218,"Clear\n\r");
      break;
    case 1:
      sprintf(local_1218,"Partly cloudy\n\r");
      break;
    case 2:
      sprintf(local_1218,"Overcast\n\r");
      break;
    case 3:
      sprintf(local_1218,"Drizzling\n\r");
      break;
    case 4:
      sprintf(local_1218,"Pouring rain\n\r");
      break;
    case 5:
      sprintf(local_1218,"Thunderstorm\n\r");
      break;
    case 6:
      sprintf(local_1218,"Snow flurries\n\r");
      break;
    case 7:
      sprintf(local_1218,"Blizzard\n\r");
      break;
    case 8:
      sprintf(local_1218,"Hail\n\r");
      break;
    default:
      sprintf(local_1218,"None (error)\n\r");
    }
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    send_to_char(in_stack_ffffffffffffed60,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    for (local_1230 = area_first; local_1230 != (AREA_DATA_conflict *)0x0;
        local_1230 = local_1230->next) {
      bVar1 = is_adjacent_area(area_00,local_1230);
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffed60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
        send_to_char(in_stack_ffffffffffffed60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
        local_121c = local_121c + 1;
      }
    }
    if (local_121c == 0) {
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    }
    else {
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    }
    if (area_00->affected == (AREA_AFFECT_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
    }
    else {
      send_to_char(in_stack_ffffffffffffed60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      for (local_1238 = area_00->affected; local_1238 != (AREA_AFFECT_DATA *)0x0;
          local_1238 = local_1238->next) {
        if (local_1238->aftype == 1) {
          sprintf(local_1218,"Skill: \'%s\' ",skill_table[local_1238->type].name);
        }
        else if (local_1238->aftype == 2) {
          sprintf(local_1218,"Power: \'%s\' ",skill_table[local_1238->type].name);
        }
        else if (local_1238->aftype == 4) {
          sprintf(local_1218,"Commune: \'%s\' ",skill_table[local_1238->type].name);
        }
        else {
          sprintf(local_1218,"Spell: \'%s\' ",skill_table[local_1238->type].name);
        }
        send_to_char(in_stack_ffffffffffffed60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
        pcVar2 = aaffect_loc_name(in_stack_ffffffffffffed5c);
        if (local_1238->duration == -1) {
          local_128c = (uint)local_1238->duration;
        }
        else {
          local_128c = (int)local_1238->duration / 2;
        }
        if (local_1238->owner == (CHAR_DATA *)0x0) {
          local_1298 = "none";
        }
        else {
          local_1298 = local_1238->owner->name;
        }
        in_stack_ffffffffffffed58 = (int)local_1238->level;
        sprintf(local_1218,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r"
                ,pcVar2,(ulong)(uint)(int)local_1238->modifier,(ulong)local_128c,"flag","nullptr",
                local_1298);
        send_to_char(in_stack_ffffffffffffed60,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58));
      }
    }
  }
  return;
}

Assistant:

void do_astat(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	int count = 0;
	AREA_DATA *area, *pArea;
	AREA_AFFECT_DATA *paf;

	area = ch->in_room->area;

	if (!area)
	{
		send_to_char("Error: No current area (!!)", ch);
		return;
	}

	sprintf(buf, "Area Name: %s\n\r", area->name);
	send_to_char(buf, ch);

	sprintf(buf, "Author: %s\n\r", area->credits);
	send_to_char(buf, ch);

	sprintf(buf, "Filename: %s\n\r", area->file_name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum range: %d to %d\n\r", area->min_vnum, area->max_vnum);
	send_to_char(buf, ch);

	sprintf(buf, "Recommended levels: %d to %d\n\r", area->low_range, area->high_range);
	send_to_char(buf, ch);

	sprintf(buf, "Area 'age': %d  [Area repops when age = 30, or 6 if empty.]\n\r", area->age);
	send_to_char(buf, ch);

	sprintf(buf, "Number of players in area: %d\n\r", area->nplayer);
	send_to_char(buf, ch);

	sprintf(buf, "Climate: %s\n\r", climate_table[area->climate].name);
	send_to_char(buf, ch);

	sprintf(buf, "Current temperature: ");
	send_to_char(buf, ch);

	switch (area->temp)
	{
		case Temperature::Hot:
			sprintf(buf, "Hot\n\r");
			break;
		case Temperature::Warm:
			sprintf(buf, "Warm\n\r");
			break;
		case Temperature::Cool:
			sprintf(buf, "Cool\n\r");
			break;
		case Temperature::Cold:
			sprintf(buf, "Cold\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);

	sprintf(buf, "Current wind conditions: ");
	send_to_char(buf, ch);

	switch (area->wind)
	{
		case Windspeed::Calm:
			sprintf(buf, "Calm\n\r");
			break;
		case Windspeed::Breeze:
			sprintf(buf, "Breeze\n\r");
			break;
		case Windspeed::Windy:
			sprintf(buf, "Windy\n\r");
			break;
		case Windspeed::Gale:
			sprintf(buf, "Gale\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);

	sprintf(buf, "Current sky conditions: ");
	send_to_char(buf, ch);

	switch (area->sky)
	{
		case WeatherCondition::Clear:
			sprintf(buf, "Clear\n\r");
			break;
		case WeatherCondition::PartlyCloudy:
			sprintf(buf, "Partly cloudy\n\r");
			break;
		case WeatherCondition::Overcast:
			sprintf(buf, "Overcast\n\r");
			break;
		case WeatherCondition::Drizzle:
			sprintf(buf, "Drizzling\n\r");
			break;
		case WeatherCondition::Downpour:
			sprintf(buf, "Pouring rain\n\r");
			break;
		case WeatherCondition::ThunderStorm:
			sprintf(buf, "Thunderstorm\n\r");
			break;
		case WeatherCondition::SnowFlurry:
			sprintf(buf, "Snow flurries\n\r");
			break;
		case WeatherCondition::Blizzard:
			sprintf(buf, "Blizzard\n\r");
			break;
		case WeatherCondition::Hail:
			sprintf(buf, "Hail\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);
	send_to_char("Adjacent areas:", ch);

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		if (is_adjacent_area(area, pArea))
		{
			send_to_char(" ", ch);
			send_to_char(pArea->name, ch);
			count++;
		}
	}

	if (count == 0)
		send_to_char(" None.\n\r", ch);
	else
		send_to_char(".\n\r", ch);

	if (area->affected)
	{
		send_to_char("The area is affected by:\n\r", ch);

		for (paf = area->affected; paf; paf = paf->next)
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);
			else
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				aaffect_loc_name(paf->location),
				paf->modifier,
				(paf->duration == -1) ? paf->duration : paf->duration / 2,
				"flag",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}
	else
	{
		send_to_char("The area is not affected by anything.\n\r", ch);
	}
}